

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void sparc_tr_translate_insn(DisasContextBase *dcbase,CPUState *cs)

{
  target_ulong val;
  TCGContext_conflict8 *tcg_ctx;
  CPUArchState_conflict19 *env;
  long lVar1;
  uint32_t insn;
  uintptr_t o_3;
  undefined1 *puVar2;
  undefined8 *puVar3;
  TCGv_i32 pTVar4;
  TCGv_i64 pTVar5;
  TCGv_i64 pTVar6;
  uintptr_t o;
  TCGTemp *ts;
  uintptr_t o_1;
  TCGTemp *ts_00;
  uintptr_t o_2;
  TranslationBlock *pTVar7;
  TCGTemp *local_78;
  TCGTemp *local_70;
  TranslationBlock *local_68;
  TCGTemp *local_60;
  TranslationBlock *local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  local_58 = dcbase[1].tb;
  val = dcbase[4].pc_next;
  tcg_ctx = *(TCGContext_conflict8 **)(val + 0x2e8);
  env = (CPUArchState_conflict19 *)cs->env_ptr;
  if (*(int *)(val + 0x57c) == 0) {
    if (*(TranslationBlock **)(val + 0x578 + (long)*(int *)(val + 0x39e0) * 8) == local_58)
    goto LAB_00a3b578;
  }
  else {
    puVar2 = (undefined1 *)g_tree_lookup(*(GTree **)(val + 0x780),&local_58);
    if (puVar2 == &DAT_00000001) {
LAB_00a3b578:
      dcbase->is_jmp = DISAS_NORETURN;
      return;
    }
  }
  puVar3 = *(undefined8 **)(val + 0x358);
  pTVar7 = dcbase[1].tb;
  while( true ) {
    if (puVar3 == (undefined8 *)0x0) goto LAB_00a3b6fe;
    lVar1 = puVar3[1];
    if ((*(TranslationBlock **)(lVar1 + 0x20) < *(TranslationBlock **)(lVar1 + 0x18) ||
         pTVar7 <= *(TranslationBlock **)(lVar1 + 0x20) &&
         *(TranslationBlock **)(lVar1 + 0x18) <= pTVar7) && (*(char *)(lVar1 + 0x14) != '\x01'))
    break;
    puVar3 = (undefined8 *)*puVar3;
  }
  tcg_gen_op2_sparc64(tcg_ctx,INDEX_op_movi_i64,(TCGArg)(tcg_ctx->cpu_pc + (long)tcg_ctx),
                      (TCGArg)pTVar7);
  pTVar7 = dcbase[1].tb;
  pTVar4 = tcg_const_i32_sparc64(tcg_ctx,4);
  pTVar5 = tcg_const_i64_sparc64(tcg_ctx,val);
  pTVar6 = tcg_const_i64_sparc64(tcg_ctx,(int64_t)pTVar7);
  ts = (TCGTemp *)(pTVar5 + (long)tcg_ctx);
  ts_00 = (TCGTemp *)(pTVar6 + (long)tcg_ctx);
  pTVar7 = (TranslationBlock *)(pTVar4 + (long)tcg_ctx);
  local_60 = (TCGTemp *)0x0;
  local_78 = ts;
  local_70 = ts_00;
  local_68 = pTVar7;
  if (*(int *)(val + 0x4f8) == 1) {
    for (puVar3 = *(undefined8 **)(val + 0x358); puVar3 != (undefined8 *)0x0;
        puVar3 = (undefined8 *)*puVar3) {
      lVar1 = puVar3[1];
      if (*(char *)(lVar1 + 0x14) == '\0') {
        pTVar5 = tcg_const_i64_sparc64(tcg_ctx,*(int64_t *)(lVar1 + 0x30));
        local_60 = (TCGTemp *)(pTVar5 + (long)tcg_ctx);
        (**(code **)(val + 0x178))(val,lVar1,&local_78,4);
        tcg_temp_free_internal_sparc64(tcg_ctx,(TCGTemp *)(pTVar5 + (long)tcg_ctx));
      }
    }
  }
  else {
    pTVar4 = tcg_const_i32_sparc64(tcg_ctx,2);
    local_58 = pTVar7;
    local_50 = (TCGTemp *)(pTVar4 + (long)tcg_ctx);
    local_48 = ts;
    local_40 = ts_00;
    tcg_gen_callN_sparc64(tcg_ctx,helper_uc_tracecode,(TCGTemp *)0x0,4,(TCGTemp **)&local_58);
    tcg_temp_free_internal_sparc64(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
  }
  tcg_temp_free_internal_sparc64(tcg_ctx,ts_00);
  tcg_temp_free_internal_sparc64(tcg_ctx,ts);
  tcg_temp_free_internal_sparc64(tcg_ctx,(TCGTemp *)pTVar7);
  check_exit_request_sparc64(tcg_ctx);
  pTVar7 = dcbase[1].tb;
LAB_00a3b6fe:
  insn = cpu_ldl_code_sparc64(env,(abi_ptr)pTVar7);
  dcbase->pc_next = dcbase->pc_next + 4;
  disas_sparc_insn((DisasContext_conflict8 *)dcbase,insn);
  if (dcbase->is_jmp == DISAS_NORETURN) {
    return;
  }
  if (dcbase[1].tb == (TranslationBlock *)dcbase->pc_next) {
    return;
  }
  dcbase->is_jmp = DISAS_TOO_MANY;
  return;
}

Assistant:

static void sparc_tr_translate_insn(DisasContextBase *dcbase, CPUState *cs)
{
    DisasContext *dc = container_of(dcbase, DisasContext, base);
    struct uc_struct *uc = dc->uc;
    TCGContext *tcg_ctx = uc->tcg_ctx;
    CPUSPARCState *env = cs->env_ptr;
    unsigned int insn;

    // Unicorn: end address tells us to stop emulation
    if (uc_addr_is_exit(uc, dc->pc)) {
#ifndef TARGET_SPARC64
        gen_helper_power_down(tcg_ctx, tcg_ctx->cpu_env);
#endif
        dcbase->is_jmp = DISAS_NORETURN;
        return;
    }

    // Unicorn: trace this instruction on request
    if (HOOK_EXISTS_BOUNDED(uc, UC_HOOK_CODE, dc->pc)) {

        // Sync PC in advance
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_pc, dc->pc);

        gen_uc_tracecode(tcg_ctx, 4, UC_HOOK_CODE_IDX, uc, dc->pc);
        // the callback might want to stop emulation immediately
        check_exit_request(tcg_ctx);
    }

    insn = translator_ldl(tcg_ctx, env, dc->pc);
    dc->base.pc_next += 4;
    disas_sparc_insn(dc, insn);

    if (dc->base.is_jmp == DISAS_NORETURN) {
        return;
    }
    if (dc->pc != dc->base.pc_next) {
        dc->base.is_jmp = DISAS_TOO_MANY;
    }
}